

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.cc
# Opt level: O1

bool __thiscall
re2::RE2::Set::Match(Set *this,StringPiece *text,vector<int,_std::allocator<int>_> *v)

{
  pointer piVar1;
  bool bVar2;
  bool failed;
  LogMessage local_198;
  
  if (this->compiled_ == false) {
    LogMessage::LogMessage
              (&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/set.cc",0x60,3)
    ;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_198.str_,"RE2::Set::Match without Compile",0x1f);
  }
  else {
    if ((v != (vector<int,_std::allocator<int>_> *)0x0) &&
       (piVar1 = (v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                 _M_start,
       (v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
       != piVar1)) {
      (v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
           piVar1;
    }
    bVar2 = Prog::SearchDFA(this->prog_,text,text,kAnchored,kManyMatch,(StringPiece *)0x0,&failed,v)
    ;
    if (failed == true) {
      LogMessage::LogMessage
                (&local_198,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/set.cc",0x69,
                 3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_198.str_,"RE2::Set::Match: DFA ran out of cache space",0x2b);
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_198);
    }
    if (!bVar2 || v == (vector<int,_std::allocator<int>_> *)0x0) {
      return bVar2;
    }
    if ((v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
        != (v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish) {
      return true;
    }
    LogMessage::LogMessage
              (&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/set.cc",0x6e,3)
    ;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_198.str_,"RE2::Set::Match: match but unknown regexp set",0x2d);
  }
  LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_198);
  return false;
}

Assistant:

bool RE2::Set::Match(const StringPiece& text, vector<int>* v) const {
  if (!compiled_) {
    LOG(DFATAL) << "RE2::Set::Match without Compile";
    return false;
  }
  if (v != NULL)
    v->clear();
  bool failed;
  bool ret = prog_->SearchDFA(text, text, Prog::kAnchored,
                              Prog::kManyMatch, NULL, &failed, v);
  if (failed)
    LOG(DFATAL) << "RE2::Set::Match: DFA ran out of cache space";

  if (ret == false)
    return false;
  if (v != NULL && v->empty()) {
    LOG(DFATAL) << "RE2::Set::Match: match but unknown regexp set";
    return false;
  }
  return true;
}